

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O1

void BuildingState::CmdSetShortDesc
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  shared_ptr<Room> room;
  shared_ptr<Player> player;
  Room *local_30;
  _Alloc_hider local_28;
  undefined8 local_18;
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Entity::GetRoom((Entity *)&stack0xffffffffffffffd0);
  Room::SetShortDesc(local_30,input);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return;
}

Assistant:

void BuildingState::CmdSetShortDesc(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto room = player->GetRoom();
    room->SetShortDesc(input);
}